

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

float nifti_mat33_determ(mat33 R)

{
  float in_stack_00000008;
  float in_stack_0000000c;
  double r33;
  double r32;
  double r31;
  double r23;
  double r22;
  double r21;
  double r13;
  double r12;
  double r11;
  
  return -(R.m[1][1] * R.m[0][2]) * R.m[0][0] +
         R.m[1][1] * in_stack_0000000c * R.m[1][0] +
         R.m[0][1] * R.m[1][2] * R.m[0][0] +
         -(R.m[0][1] * in_stack_0000000c) * R.m[2][0] +
         in_stack_00000008 * R.m[0][2] * R.m[2][0] + -(in_stack_00000008 * R.m[1][2] * R.m[1][0]);
}

Assistant:

float nifti_mat33_determ( mat33 R )   /* determinant of 3x3 matrix */
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33 ;
                                                       /*  INPUT MATRIX:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 ] */

   return (float)(r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13) ;
}